

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O3

void __thiscall
chrono::ChSystemDescriptor::ConvertToMatrixForm
          (ChSystemDescriptor *this,ChSparseMatrix *Z,ChVectorDynamic<> *rhs)

{
  pointer ppCVar1;
  double *pdVar2;
  double *pdVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  pointer ppCVar7;
  pointer ppCVar8;
  pointer ppCVar9;
  ChVariables *pCVar10;
  ChKblock *pCVar11;
  ChConstraint *pCVar12;
  double *pdVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  int iVar21;
  uint uVar22;
  Index size;
  long lVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  ChVectorRef local_48;
  
  ppCVar4 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar5 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar6 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar7 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar23 = (long)ppCVar6 - (long)ppCVar7 >> 3;
  if (ppCVar6 == ppCVar7) {
    iVar33 = 0;
  }
  else {
    lVar25 = 0;
    iVar33 = 0;
    do {
      ppCVar1 = ppCVar7 + lVar25;
      lVar25 = lVar25 + 1;
      iVar33 = iVar33 + (uint)(*ppCVar1)->active;
    } while (lVar23 + (ulong)(lVar23 == 0) != lVar25);
  }
  ppCVar8 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar9 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar25 = (long)ppCVar4 - (long)ppCVar5 >> 3;
  iVar21 = (*this->_vptr_ChSystemDescriptor[7])(this);
  this->n_q = iVar21;
  if (Z != (ChSparseMatrix *)0x0) {
    Eigen::SparseMatrix<double,_1,_int>::conservativeResize
              (Z,(long)(iVar21 + iVar33),(long)(iVar21 + iVar33));
    Eigen::SparseMatrix<double,_1,_int>::setZeroValues(Z);
    if (ppCVar4 != ppCVar5) {
      lVar31 = 0;
      uVar24 = 0;
      do {
        pCVar10 = (this->vvariables).
                  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar31];
        if (pCVar10->disabled == false) {
          (*pCVar10->_vptr_ChVariables[9])(this->c_a,pCVar10,Z,uVar24,uVar24);
          iVar21 = (*(this->vvariables).
                     super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar31]->_vptr_ChVariables[2])();
          uVar24 = (ulong)(uint)((int)uVar24 + iVar21);
        }
        lVar31 = lVar31 + 1;
      } while (lVar25 + (ulong)(lVar25 == 0) != lVar31);
    }
    if (ppCVar8 != ppCVar9) {
      lVar32 = (long)ppCVar8 - (long)ppCVar9 >> 3;
      lVar31 = 0;
      do {
        pCVar11 = (this->vstiffness).
                  super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar31];
        (*pCVar11->_vptr_ChKblock[6])(pCVar11,Z,1);
        lVar31 = lVar31 + 1;
      } while (lVar32 + (ulong)(lVar32 == 0) != lVar31);
    }
    if (ppCVar6 != ppCVar7) {
      lVar31 = 0;
      iVar21 = 0;
      do {
        pCVar12 = (this->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar31];
        if (pCVar12->active == true) {
          (*pCVar12->_vptr_ChConstraint[0xd])(pCVar12,Z,(ulong)(uint)(this->n_q + iVar21));
          pCVar12 = (this->vconstraints).
                    super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar31];
          (*pCVar12->_vptr_ChConstraint[0xe])(pCVar12,Z,(ulong)(uint)(this->n_q + iVar21));
          uVar26 = this->n_q + iVar21;
          (**Z->_vptr_SparseMatrix)
                    ((this->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar31]->cfm_i,Z,(ulong)uVar26,
                     (ulong)uVar26,1);
          iVar21 = iVar21 + 1;
        }
        lVar31 = lVar31 + 1;
      } while (lVar23 + (ulong)(lVar23 == 0) != lVar31);
    }
  }
  if (rhs != (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)iVar33 + (long)this->n_q,1);
    lVar31 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (lVar31 < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (lVar31 != 0) {
      memset((rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,
             0,lVar31 << 3);
    }
    if (ppCVar4 != ppCVar5) {
      lVar31 = 0;
      uVar26 = 0;
      do {
        pCVar10 = (this->vvariables).
                  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar31];
        if (pCVar10->disabled == false) {
          ChVariables::Get_fb(&local_48,pCVar10);
          uVar22 = (*(this->vvariables).
                     super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar31]->_vptr_ChVariables[2])();
          pdVar13 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          if ((int)uVar22 < 0 && pdVar13 != (double *)0x0) {
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                         );
          }
          uVar24 = (ulong)(int)uVar22;
          if (((int)(uVar22 | uVar26) < 0) ||
             ((long)((rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                     .m_rows - uVar24) < (long)(int)uVar26)) {
            __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                          "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                         );
          }
          if (local_48.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._8_8_ != uVar24) {
            __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                          "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                         );
          }
          pdVar13 = pdVar13 + (int)uVar26;
          uVar27 = uVar24;
          if ((((ulong)pdVar13 & 7) == 0) &&
             (uVar27 = (ulong)(-((uint)((ulong)pdVar13 >> 3) & 0x1fffffff) & 7),
             (long)uVar24 <= (long)uVar27)) {
            uVar27 = uVar24;
          }
          uVar29 = uVar24 - uVar27;
          uVar28 = uVar29 + 7;
          if (-1 < (long)uVar29) {
            uVar28 = uVar29;
          }
          if (0 < (long)uVar27) {
            uVar30 = 0;
            do {
              pdVar13[uVar30] =
                   *(double *)
                    (local_48.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + uVar30 * 8);
              uVar30 = uVar30 + 1;
            } while (uVar27 != uVar30);
          }
          uVar28 = (uVar28 & 0xfffffffffffffff8) + uVar27;
          if (7 < (long)uVar29) {
            do {
              pdVar2 = (double *)
                       (local_48.
                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                        ._0_8_ + uVar27 * 8);
              dVar14 = pdVar2[1];
              dVar15 = pdVar2[2];
              dVar16 = pdVar2[3];
              dVar17 = pdVar2[4];
              dVar18 = pdVar2[5];
              dVar19 = pdVar2[6];
              dVar20 = pdVar2[7];
              pdVar3 = pdVar13 + uVar27;
              *pdVar3 = *pdVar2;
              pdVar3[1] = dVar14;
              pdVar3[2] = dVar15;
              pdVar3[3] = dVar16;
              pdVar3[4] = dVar17;
              pdVar3[5] = dVar18;
              pdVar3[6] = dVar19;
              pdVar3[7] = dVar20;
              uVar27 = uVar27 + 8;
            } while ((long)uVar27 < (long)uVar28);
          }
          if ((long)uVar28 < (long)uVar24) {
            do {
              pdVar13[uVar28] =
                   *(double *)
                    (local_48.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + uVar28 * 8);
              uVar28 = uVar28 + 1;
            } while (uVar24 != uVar28);
          }
          iVar33 = (*(this->vvariables).
                     super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar31]->_vptr_ChVariables[2])();
          uVar26 = uVar26 + iVar33;
        }
        lVar31 = lVar31 + 1;
      } while (lVar31 != lVar25 + (ulong)(lVar25 == 0));
    }
    if (ppCVar6 != ppCVar7) {
      ppCVar6 = (this->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar33 = this->n_q;
      lVar25 = 0;
      iVar21 = 0;
      do {
        pCVar12 = ppCVar6[lVar25];
        if (pCVar12->active == true) {
          lVar31 = (long)iVar21 + (long)iVar33;
          if (((int)lVar31 < 0) ||
             ((rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              <= lVar31)) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          iVar21 = iVar21 + 1;
          (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
          [lVar31] = -pCVar12->b_i;
        }
        lVar25 = lVar25 + 1;
      } while (lVar23 + (ulong)(lVar23 == 0) != lVar25);
    }
  }
  return;
}

Assistant:

void ChSystemDescriptor::ConvertToMatrixForm(ChSparseMatrix* Z, ChVectorDynamic<>* rhs) {
    std::vector<ChConstraint*>& mconstraints = GetConstraintsList();
    std::vector<ChVariables*>& mvariables = GetVariablesList();

    auto mv_size = mvariables.size();
    auto mc_size = mconstraints.size();
    auto vs_size = vstiffness.size();

    // Count constraints.
    int mn_c = 0;
    for (size_t ic = 0; ic < mc_size; ic++) {
        if (mconstraints[ic]->IsActive())
            mn_c++;
    }

    // Count active variables, by scanning through all variable blocks, and set offsets.
    n_q = CountActiveVariables();

    if (Z) {
        Z->conservativeResize(n_q + mn_c, n_q + mn_c);
        Z->setZeroValues();        

        // Fill Z with masses and inertias.
        int s_q = 0;
        for (size_t iv = 0; iv < mv_size; iv++) {
            if (mvariables[iv]->IsActive()) {
                // Masses and inertias in upper-left block of Z
                mvariables[iv]->Build_M(*Z, s_q, s_q, c_a);
                s_q += mvariables[iv]->Get_ndof();
            }
        }

        // If present, add stiffness matrix K to upper-left block of Z.
        for (size_t ik = 0; ik < vs_size; ik++) {
            vstiffness[ik]->Build_K(*Z, true);
        }

        // Fill Z by looping over constraints.
        int s_c = 0;
        for (size_t ic = 0; ic < mc_size; ic++) {
            if (mconstraints[ic]->IsActive()) {
                // Constraint Jacobian in lower-left block of Z
                mconstraints[ic]->Build_Cq(*Z, n_q + s_c);
                // Transposed constraint Jacobian in upper-right block of Z
                mconstraints[ic]->Build_CqT(*Z, n_q + s_c);
                // E ( = cfm ) in lower-right block of Z
                Z->SetElement(n_q + s_c, n_q + s_c, mconstraints[ic]->Get_cfm_i());
                s_c++;
            }
        }
    }

    if (rhs) {
        rhs->setZero(n_q + mn_c, 1);

        // Fill rhs with forces.
        int s_q = 0;
        for (size_t iv = 0; iv < mv_size; iv++) {
            if (mvariables[iv]->IsActive()) {
                // Forces in upper section of rhs
                rhs->segment(s_q, vvariables[iv]->Get_ndof()) = vvariables[iv]->Get_fb();
                s_q += mvariables[iv]->Get_ndof();
            }
        }

        // Fill rhs by looping over constraints.
        int s_c = 0;
        for (size_t ic = 0; ic < mc_size; ic++) {
            if (mconstraints[ic]->IsActive()) {
                // -b term in lower section of rhs
                (*rhs)(n_q + s_c) = -(mconstraints[ic]->Get_b_i());
                s_c++;
            }
        }
    }
}